

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multi_closed(Curl_easy *data,curl_socket_t s)

{
  Curl_multi *multi_00;
  Curl_sh_entry *entry_00;
  int local_2c;
  int rc;
  Curl_sh_entry *entry;
  Curl_multi *multi;
  curl_socket_t s_local;
  Curl_easy *data_local;
  
  if (((data != (Curl_easy *)0x0) && (multi_00 = data->multi, multi_00 != (Curl_multi *)0x0)) &&
     (entry_00 = sh_getentry(&multi_00->sockhash,s), entry_00 != (Curl_sh_entry *)0x0)) {
    local_2c = 0;
    if (multi_00->socket_cb != (curl_socket_callback)0x0) {
      set_in_callback(multi_00,true);
      local_2c = (*multi_00->socket_cb)(data,s,4,multi_00->socket_userp,entry_00->socketp);
      set_in_callback(multi_00,false);
    }
    sh_delentry(entry_00,&multi_00->sockhash,s);
    if (local_2c == -1) {
      multi_00->dead = true;
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct Curl_easy *data, curl_socket_t s)
{
  if(data) {
    /* if there's still an easy handle associated with this connection */
    struct Curl_multi *multi = data->multi;
    if(multi) {
      /* this is set if this connection is part of a handle that is added to
         a multi handle, and only then this is necessary */
      struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

      if(entry) {
        int rc = 0;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
        }

        /* now remove it from the socket hash */
        sh_delentry(entry, &multi->sockhash, s);
        if(rc == -1)
          /* This just marks the multi handle as "dead" without returning an
             error code primarily because this function is used from many
             places where propagating an error back is tricky. */
          multi->dead = TRUE;
      }
    }
  }
}